

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractDOMParser.cpp
# Opt level: O1

void __thiscall
xercesc_4_0::AbstractDOMParser::docCharacters
          (AbstractDOMParser *this,XMLCh *chars,XMLSize_t length,bool cdataSection)

{
  int iVar1;
  undefined4 extraout_var;
  long *plVar3;
  undefined4 extraout_var_00;
  long lVar4;
  DOMException *this_00;
  undefined8 *puVar5;
  DOMNode *pDVar2;
  
  if (this->fWithinElement != true) {
    return;
  }
  if (cdataSection) {
    iVar1 = (*(this->super_XMLDocumentHandler)._vptr_XMLDocumentHandler[0x22])(this,chars,length);
    pDVar2 = (DOMNode *)CONCAT44(extraout_var,iVar1);
    if (this->fCurrentParent == (DOMNode *)0x0) {
      plVar3 = (long *)0x0;
    }
    else {
      plVar3 = (long *)__dynamic_cast(this->fCurrentParent,&DOMNode::typeinfo,
                                      &HasDOMParentImpl::typeinfo,0xfffffffffffffffe);
    }
    if ((plVar3 != (long *)0x0) && (lVar4 = (**(code **)(*plVar3 + 0x10))(plVar3), lVar4 != 0)) {
LAB_002df5cd:
      puVar5 = (undefined8 *)(**(code **)(*plVar3 + 0x10))(plVar3);
      (**(code **)*puVar5)(puVar5,pDVar2);
      this->fCurrentNode = pDVar2;
      return;
    }
    this_00 = (DOMException *)__cxa_allocate_exception(0x28);
    DOMException::DOMException(this_00,0xb,0,XMLPlatformUtils::fgMemoryManager);
  }
  else {
    iVar1 = (*this->fCurrentNode->_vptr_DOMNode[4])();
    if (iVar1 == 3) {
      DOMTextImpl::appendDataFast((DOMTextImpl *)this->fCurrentNode,chars,length);
      return;
    }
    iVar1 = (*(this->super_XMLDocumentHandler)._vptr_XMLDocumentHandler[0x23])(this,chars,length);
    pDVar2 = (DOMNode *)CONCAT44(extraout_var_00,iVar1);
    if (this->fCurrentParent == (DOMNode *)0x0) {
      plVar3 = (long *)0x0;
    }
    else {
      plVar3 = (long *)__dynamic_cast(this->fCurrentParent,&DOMNode::typeinfo,
                                      &HasDOMParentImpl::typeinfo,0xfffffffffffffffe);
    }
    if ((plVar3 != (long *)0x0) && (lVar4 = (**(code **)(*plVar3 + 0x10))(plVar3), lVar4 != 0))
    goto LAB_002df5cd;
    this_00 = (DOMException *)__cxa_allocate_exception(0x28);
    DOMException::DOMException(this_00,0xb,0,XMLPlatformUtils::fgMemoryManager);
  }
  __cxa_throw(this_00,&DOMException::typeinfo,DOMException::~DOMException);
}

Assistant:

void AbstractDOMParser::docCharacters(  const   XMLCh* const    chars
                              , const XMLSize_t    length
                              , const bool         cdataSection)
{
    // Ignore chars outside of content
    if (!fWithinElement)
        return;

    if (cdataSection == true)
    {
        DOMCDATASection *node = createCDATASection (chars, length);
        castToParentImpl (fCurrentParent)->appendChildFast (node);
        fCurrentNode = node;
    }
    else
    {
        if (fCurrentNode->getNodeType() == DOMNode::TEXT_NODE)
        {
            DOMTextImpl *node = (DOMTextImpl*)fCurrentNode;
            node->appendDataFast(chars, length);
        }
        else
        {
            DOMText *node = createText (chars, length);
            castToParentImpl (fCurrentParent)->appendChildFast (node);
            fCurrentNode = node;
        }
    }
}